

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall
cmGeneratorTarget::ComputePDBOutputDir
          (cmGeneratorTarget *this,string *kind,string *config,string *out)

{
  cmLocalGenerator *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  ulong uVar4;
  string *psVar5;
  cmGlobalGenerator *pcVar6;
  allocator<char> local_301;
  string local_300 [39];
  allocator<char> local_2d9;
  string local_2d8 [32];
  string local_2b8;
  undefined4 local_294;
  string local_290;
  string local_270;
  string local_250;
  cmValue local_230;
  cmValue outdir;
  string local_208;
  string local_1e8;
  cmValue local_1c8;
  cmValue config_outdir;
  cmAlphaNum local_190;
  string local_160;
  undefined1 local_140 [8];
  string configProp;
  string configUpper;
  string conf;
  cmAlphaNum local_a0;
  string local_70;
  undefined1 local_50 [8];
  string propertyName;
  string *out_local;
  string *config_local;
  string *kind_local;
  cmGeneratorTarget *this_local;
  
  propertyName.field_2._8_8_ = out;
  std::__cxx11::string::string((string *)local_50);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    cmAlphaNum::cmAlphaNum(&local_a0,kind);
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&conf.field_2 + 8),"_OUTPUT_DIRECTORY");
    cmStrCat<>(&local_70,&local_a0,(cmAlphaNum *)((long)&conf.field_2 + 8));
    std::__cxx11::string::operator=((string *)local_50,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  std::__cxx11::string::string((string *)(configUpper.field_2._M_local_buf + 8),(string *)config);
  cmsys::SystemTools::UpperCase
            ((string *)((long)&configProp.field_2 + 8),(string *)((long)&configUpper.field_2 + 8));
  std::__cxx11::string::string((string *)local_140);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    cmAlphaNum::cmAlphaNum(&local_190,kind);
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)&config_outdir,"_OUTPUT_DIRECTORY_");
    cmStrCat<std::__cxx11::string>
              (&local_160,&local_190,(cmAlphaNum *)&config_outdir,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&configProp.field_2 + 8));
    std::__cxx11::string::operator=((string *)local_140,(string *)&local_160);
    std::__cxx11::string::~string((string *)&local_160);
  }
  local_1c8 = GetProperty(this,(string *)local_140);
  bVar3 = cmValue::operator_cast_to_bool(&local_1c8);
  if (bVar3) {
    psVar5 = cmValue::operator*[abi_cxx11_(&local_1c8);
    std::__cxx11::string::string((string *)&local_208,(string *)psVar5);
    pcVar1 = this->LocalGenerator;
    std::__cxx11::string::string((string *)&outdir);
    cmGeneratorExpression::Evaluate
              (&local_1e8,&local_208,pcVar1,config,(cmGeneratorTarget *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,(string *)&outdir);
    std::__cxx11::string::operator=((string *)propertyName.field_2._8_8_,(string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&outdir);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::clear();
  }
  else {
    local_230 = GetProperty(this,(string *)local_50);
    bVar3 = cmValue::operator_cast_to_bool(&local_230);
    if (bVar3) {
      psVar5 = cmValue::operator*[abi_cxx11_(&local_230);
      std::__cxx11::string::string((string *)&local_270,(string *)psVar5);
      pcVar1 = this->LocalGenerator;
      std::__cxx11::string::string((string *)&local_290);
      cmGeneratorExpression::Evaluate
                (&local_250,&local_270,pcVar1,config,(cmGeneratorTarget *)0x0,
                 (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&local_290);
      std::__cxx11::string::operator=((string *)propertyName.field_2._8_8_,(string *)&local_250);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_270);
      uVar2 = propertyName.field_2._8_8_;
      psVar5 = cmValue::operator*[abi_cxx11_(&local_230);
      bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              uVar2,psVar5);
      if (bVar3) {
        std::__cxx11::string::clear();
      }
    }
  }
  uVar4 = std::__cxx11::string::empty();
  uVar2 = propertyName.field_2._8_8_;
  if ((uVar4 & 1) == 0) {
    psVar5 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this->LocalGenerator);
    cmsys::SystemTools::CollapseFullPath(&local_2b8,(string *)uVar2,psVar5);
    std::__cxx11::string::operator=((string *)propertyName.field_2._8_8_,(string *)&local_2b8);
    std::__cxx11::string::~string((string *)&local_2b8);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      pcVar6 = cmLocalGenerator::GetGlobalGenerator(this->LocalGenerator);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_2d8,"/",&local_2d9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_300,"",&local_301);
      (*pcVar6->_vptr_cmGlobalGenerator[0x18])
                (pcVar6,local_2d8,(undefined1 *)((long)&configUpper.field_2 + 8),local_300,
                 propertyName.field_2._8_8_);
      std::__cxx11::string::~string(local_300);
      std::allocator<char>::~allocator(&local_301);
      std::__cxx11::string::~string(local_2d8);
      std::allocator<char>::~allocator(&local_2d9);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  local_294 = 1;
  std::__cxx11::string::~string((string *)local_140);
  std::__cxx11::string::~string((string *)(configProp.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(configUpper.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_50);
  return this_local._7_1_;
}

Assistant:

bool cmGeneratorTarget::ComputePDBOutputDir(const std::string& kind,
                                            const std::string& config,
                                            std::string& out) const
{
  // Look for a target property defining the target output directory
  // based on the target type.
  std::string propertyName;
  if (!kind.empty()) {
    propertyName = cmStrCat(kind, "_OUTPUT_DIRECTORY");
  }
  std::string conf = config;

  // Check for a per-configuration output directory target property.
  std::string configUpper = cmSystemTools::UpperCase(conf);
  std::string configProp;
  if (!kind.empty()) {
    configProp = cmStrCat(kind, "_OUTPUT_DIRECTORY_", configUpper);
  }

  // Select an output directory.
  if (cmValue config_outdir = this->GetProperty(configProp)) {
    // Use the user-specified per-configuration output directory.
    out = cmGeneratorExpression::Evaluate(*config_outdir, this->LocalGenerator,
                                          config);

    // Skip per-configuration subdirectory.
    conf.clear();
  } else if (cmValue outdir = this->GetProperty(propertyName)) {
    // Use the user-specified output directory.
    out =
      cmGeneratorExpression::Evaluate(*outdir, this->LocalGenerator, config);

    // Skip per-configuration subdirectory if the value contained a
    // generator expression.
    if (out != *outdir) {
      conf.clear();
    }
  }
  if (out.empty()) {
    return false;
  }

  // Convert the output path to a full path in case it is
  // specified as a relative path.  Treat a relative path as
  // relative to the current output directory for this makefile.
  out = (cmSystemTools::CollapseFullPath(
    out, this->LocalGenerator->GetCurrentBinaryDirectory()));

  // The generator may add the configuration's subdirectory.
  if (!conf.empty()) {
    this->LocalGenerator->GetGlobalGenerator()->AppendDirectoryForConfig(
      "/", conf, "", out);
  }
  return true;
}